

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void Shutdown(NodeContext *node)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *this;
  long lVar1;
  CTxMemPool *pCVar2;
  pointer puVar3;
  PeerManager *pPVar4;
  ValidationSignals *pVVar5;
  CConnman *this_00;
  ChainstateManager *pCVar6;
  CScheduler *this_01;
  CBlockPolicyEstimator *pCVar7;
  CoinsViews *pCVar8;
  pointer ppBVar9;
  Chainstate *this_02;
  FopenFn mockable_fopen_function;
  size_type sVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_> *client;
  _Alloc_hider _Var14;
  pointer ppBVar15;
  pointer puVar16;
  vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
  *__range1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  Level in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char (*in_stack_ffffffffffffff08) [9];
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *this_03;
  _Invoker_type in_stack_ffffffffffffff10;
  unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *this_04;
  _Function_base local_e0;
  code *local_c8;
  error_code error;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock_shutdown;
  string local_a0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  path pid_path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (Shutdown(node::NodeContext&)::g_shutdown_mutex == '\0') {
    iVar13 = __cxa_guard_acquire(&Shutdown(node::NodeContext&)::g_shutdown_mutex);
    if (iVar13 != 0) {
      __cxa_guard_release(&Shutdown(node::NodeContext&)::g_shutdown_mutex);
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock_shutdown,&Shutdown::g_shutdown_mutex,"g_shutdown_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp",
             0x10f,true);
  if (lock_shutdown.super_unique_lock._M_owns != false) {
    logging_function._M_str = "Shutdown";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file._M_len = 0x51;
    LogPrintf_<char[9]>(logging_function,source_file,0x111,
                        I2P|VALIDATION|QT|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|
                        ESTIMATEFEE|RPC|ZMQ,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                        in_stack_ffffffffffffff08);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node->args;
    inline_assertion_check<true,ArgsManager*&>
              ((ArgsManager **)args_1,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp",
               0x112,"Shutdown","node.args");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pid_path,"shutoff",(allocator<char> *)&criticalblock22);
    util::ThreadRename((string *)&pid_path);
    std::__cxx11::string::~string((string *)&pid_path);
    pCVar2 = (node->mempool)._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    if (pCVar2 != (CTxMemPool *)0x0) {
      CTxMemPool::AddTransactionsUpdated(pCVar2,1);
    }
    StopHTTPRPC();
    StopREST();
    StopRPC();
    StopHTTPServer();
    this_03 = &node->mempool;
    puVar3 = (node->chain_clients).
             super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (node->chain_clients).
                   super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
        puVar16 = puVar16 + 1) {
      (*((puVar16->_M_t).
         super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
         ._M_t.
         super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
         .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl)->_vptr_ChainClient
        [6])();
    }
    StopMapPort();
    pPVar4 = (node->peerman)._M_t.
             super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
             super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
             super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
    if ((pPVar4 != (PeerManager *)0x0) &&
       (pVVar5 = (node->validation_signals)._M_t.
                 super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                 .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl,
       pVVar5 != (ValidationSignals *)0x0)) {
      ValidationSignals::UnregisterValidationInterface(pVVar5,&pPVar4->super_CValidationInterface);
    }
    this_00 = (node->connman)._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>.
              _M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
              super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
    if (this_00 != (CConnman *)0x0) {
      CConnman::Stop(this_00);
    }
    StopTorControl();
    pCVar6 = (node->chainman)._M_t.
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
    if ((pCVar6 != (ChainstateManager *)0x0) && ((pCVar6->m_thread_load)._M_id._M_thread != 0)) {
      std::thread::join();
    }
    this_01 = (node->scheduler)._M_t.
              super___uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>._M_t.
              super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
              super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl;
    if (this_01 != (CScheduler *)0x0) {
      CScheduler::stop(this_01);
    }
    pPVar4 = (node->peerman)._M_t.
             super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
             super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
             super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
    (node->peerman)._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
    super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl = (PeerManager *)0x0;
    if (pPVar4 != (PeerManager *)0x0) {
      (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0xb])();
    }
    std::__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>::reset
              ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&node->connman,
               (pointer)0x0);
    std::__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>::reset
              ((__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> *)&node->banman,(pointer)0x0);
    std::__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>::reset
              ((__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> *)&node->addrman,
               (pointer)0x0);
    std::__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>::reset
              ((__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                *)&node->netgroupman,(pointer)0x0);
    pCVar2 = (node->mempool)._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    if (pCVar2 != (CTxMemPool *)0x0) {
      bVar11 = CTxMemPool::GetLoadTried(pCVar2);
      if (bVar11) {
        bVar11 = ::node::ShouldPersistMempool((ArgsManager *)(args_1->_M_dataplus)._M_p);
        if (bVar11) {
          pCVar2 = (this_03->_M_t).
                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                   super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
          ::node::MempoolPath(&pid_path,(ArgsManager *)(args_1->_M_dataplus)._M_p);
          local_e0._M_functor._8_8_ = 0;
          local_e0._M_functor._M_unused._M_object = fsbridge::fopen;
          local_c8 = std::
                     _Function_handler<_IO_FILE_*(const_fs::path_&,_const_char_*),__IO_FILE_*(*)(const_fs::path_&,_const_char_*)>
                     ::_M_invoke;
          local_e0._M_manager =
               std::
               _Function_handler<_IO_FILE_*(const_fs::path_&,_const_char_*),__IO_FILE_*(*)(const_fs::path_&,_const_char_*)>
               ::_M_manager;
          mockable_fopen_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffefc;
          mockable_fopen_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffef8;
          mockable_fopen_function.super__Function_base._M_functor._8_8_ = args_1;
          mockable_fopen_function.super__Function_base._M_manager = (_Manager_type)this_03;
          mockable_fopen_function._M_invoker = in_stack_ffffffffffffff10;
          ::node::DumpMempool(pCVar2,&pid_path,mockable_fopen_function,SUB81(&local_e0,0));
          std::_Function_base::~_Function_base(&local_e0);
          std::filesystem::__cxx11::path::~path(&pid_path.super_path);
        }
      }
    }
    pCVar7 = (node->fee_estimator)._M_t.
             super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
             ._M_t.
             super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
             .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
    if (pCVar7 != (CBlockPolicyEstimator *)0x0) {
      CBlockPolicyEstimator::Flush(pCVar7);
      pVVar5 = (node->validation_signals)._M_t.
               super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
               _M_t.
               super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
               super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
      if (pVVar5 != (ValidationSignals *)0x0) {
        ValidationSignals::UnregisterValidationInterface
                  (pVVar5,&((node->fee_estimator)._M_t.
                            super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
                            .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl)->
                           super_CValidationInterface);
      }
    }
    this = &node->chainman;
    if ((this->_M_t).
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock22,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp"
                 ,0x148,false);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path,
                 (this->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      sVar10 = pid_path.super_path._M_pathname._M_string_length;
      for (_Var14 = pid_path.super_path._M_pathname._M_dataplus; _Var14._M_p != (pointer)sVar10;
          _Var14._M_p = _Var14._M_p + 8) {
        pCVar8 = ((*(Chainstate **)_Var14._M_p)->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar8 != (CoinsViews *)0x0) &&
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar8->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> !=
            (CCoinsViewCache *)0x0)) {
          Chainstate::ForceFlushStateToDisk(*(Chainstate **)_Var14._M_p);
        }
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
    }
    pVVar5 = (node->validation_signals)._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (pVVar5 != (ValidationSignals *)0x0) {
      ValidationSignals::FlushBackgroundCallbacks(pVVar5);
    }
    this_04 = &node->validation_signals;
    ppBVar9 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar15 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppBVar15 != ppBVar9;
        ppBVar15 = ppBVar15 + 1) {
      BaseIndex::Stop(*ppBVar15);
    }
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      std::__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>::reset
                ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_> *)&g_txindex,(pointer)0x0)
      ;
    }
    if ((__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)
        g_coin_stats_index._M_t.
        super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
        super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
        super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)0x0) {
      std::__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>::reset
                ((__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_> *)
                 &g_coin_stats_index,(pointer)0x0);
    }
    DestroyAllBlockFilterIndexes();
    ppBVar15 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppBVar15) {
      (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppBVar15;
    }
    if ((this->_M_t).
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock22,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp"
                 ,0x162,false);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path,
                 (this->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      for (_Var14 = pid_path.super_path._M_pathname._M_dataplus;
          _Var14._M_p != (pointer)pid_path.super_path._M_pathname._M_string_length;
          _Var14._M_p = _Var14._M_p + 8) {
        this_02 = *(Chainstate **)_Var14._M_p;
        pCVar8 = (this_02->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar8 != (CoinsViews *)0x0) &&
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar8->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> !=
            (CCoinsViewCache *)0x0)) {
          Chainstate::ForceFlushStateToDisk(this_02);
          Chainstate::ResetCoinsViews(this_02);
        }
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
    }
    puVar3 = (node->chain_clients).
             super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (node->chain_clients).
                   super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
        puVar16 = puVar16 + 1) {
      (*((puVar16->_M_t).
         super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
         ._M_t.
         super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
         .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl)->_vptr_ChainClient
        [7])();
    }
    std::
    vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
    ::clear(&node->chain_clients);
    pVVar5 = (this_04->_M_t).
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (pVVar5 != (ValidationSignals *)0x0) {
      ValidationSignals::UnregisterAllValidationInterfaces(pVVar5);
    }
    std::__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>::reset
              ((__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_03,(pointer)0x0
              );
    pCVar7 = (node->fee_estimator)._M_t.
             super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
             ._M_t.
             super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
             .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
    (node->fee_estimator)._M_t.
    super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
    super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
    super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
         (CBlockPolicyEstimator *)0x0;
    if (pCVar7 != (CBlockPolicyEstimator *)0x0) {
      (*(pCVar7->super_CValidationInterface)._vptr_CValidationInterface[0xb])();
    }
    std::__uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>::reset
              ((__uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this,
               (pointer)0x0);
    std::__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>::reset
              ((__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               this_04,(pointer)0x0);
    std::__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>::reset
              ((__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> *)&node->scheduler,
               (pointer)0x0);
    std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
              ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)&node->ecc_context
               ,(pointer)0x0);
    std::__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>::reset
              ((__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_> *)node,
               (pointer)0x0);
    if (g_generated_pid == '\x01') {
      GetPidFile(&pid_path,(ArgsManager *)(args_1->_M_dataplus)._M_p);
      error._M_value = 0;
      error._M_cat = (error_category *)std::_V2::system_category();
      cVar12 = std::filesystem::remove(&pid_path.super_path,&error);
      if (cVar12 == '\0') {
        if (error._M_value == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock22,"File does not exist",(allocator<char> *)&local_a0);
        }
        else {
          (**(code **)(*(long *)error._M_cat + 0x20))(&criticalblock22);
        }
        std::filesystem::__cxx11::path::string(&local_a0,&pid_path.super_path);
        logging_function_00._M_str = "RemovePidFile";
        logging_function_00._M_len = 0xd;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
        source_file_00._M_len = 0x51;
        LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xc2,
                   I2P|VALIDATION|QT|MEMPOOLREJ|PROXY|CMPCTBLOCK|REINDEX|SELECTCOINS|RPC|WALLETDB|
                   ZMQ|BENCH|HTTP|NET,(Level)&local_a0,(char *)&criticalblock22,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),args_1);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&criticalblock22);
      }
      std::filesystem::__cxx11::path::~path(&pid_path.super_path);
    }
    logging_function_01._M_str = "Shutdown";
    logging_function_01._M_len = 8;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file_01._M_len = 0x51;
    LogPrintf_<char[9]>(logging_function_01,source_file_01,0x183,
                        I2P|VALIDATION|QT|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|
                        ESTIMATEFEE|RPC|ZMQ|BENCH|HTTP|MEMPOOL,in_stack_fffffffffffffef8,
                        (char *)args_1,(char (*) [9])this_03);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock_shutdown.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Shutdown(NodeContext& node)
{
    static Mutex g_shutdown_mutex;
    TRY_LOCK(g_shutdown_mutex, lock_shutdown);
    if (!lock_shutdown) return;
    LogPrintf("%s: In progress...\n", __func__);
    Assert(node.args);

    /// Note: Shutdown() must be able to handle cases in which initialization failed part of the way,
    /// for example if the data directory was found to be locked.
    /// Be sure that anything that writes files or flushes caches only does this if the respective
    /// module was initialized.
    util::ThreadRename("shutoff");
    if (node.mempool) node.mempool->AddTransactionsUpdated(1);

    StopHTTPRPC();
    StopREST();
    StopRPC();
    StopHTTPServer();
    for (const auto& client : node.chain_clients) {
        client->flush();
    }
    StopMapPort();

    // Because these depend on each-other, we make sure that neither can be
    // using the other before destroying them.
    if (node.peerman && node.validation_signals) node.validation_signals->UnregisterValidationInterface(node.peerman.get());
    if (node.connman) node.connman->Stop();

    StopTorControl();

    if (node.chainman && node.chainman->m_thread_load.joinable()) node.chainman->m_thread_load.join();
    // After everything has been shut down, but before things get flushed, stop the
    // the scheduler. After this point, SyncWithValidationInterfaceQueue() should not be called anymore
    // as this would prevent the shutdown from completing.
    if (node.scheduler) node.scheduler->stop();

    // After the threads that potentially access these pointers have been stopped,
    // destruct and reset all to nullptr.
    node.peerman.reset();
    node.connman.reset();
    node.banman.reset();
    node.addrman.reset();
    node.netgroupman.reset();

    if (node.mempool && node.mempool->GetLoadTried() && ShouldPersistMempool(*node.args)) {
        DumpMempool(*node.mempool, MempoolPath(*node.args));
    }

    // Drop transactions we were still watching, record fee estimations and unregister
    // fee estimator from validation interface.
    if (node.fee_estimator) {
        node.fee_estimator->Flush();
        if (node.validation_signals) {
            node.validation_signals->UnregisterValidationInterface(node.fee_estimator.get());
        }
    }

    // FlushStateToDisk generates a ChainStateFlushed callback, which we should avoid missing
    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
            }
        }
    }

    // After there are no more peers/RPC left to give us new data which may generate
    // CValidationInterface callbacks, flush them...
    if (node.validation_signals) node.validation_signals->FlushBackgroundCallbacks();

    // Stop and delete all indexes only after flushing background callbacks.
    for (auto* index : node.indexes) index->Stop();
    if (g_txindex) g_txindex.reset();
    if (g_coin_stats_index) g_coin_stats_index.reset();
    DestroyAllBlockFilterIndexes();
    node.indexes.clear(); // all instances are nullptr now

    // Any future callbacks will be dropped. This should absolutely be safe - if
    // missing a callback results in an unrecoverable situation, unclean shutdown
    // would too. The only reason to do the above flushes is to let the wallet catch
    // up with our current chain to avoid any strange pruning edge cases and make
    // next startup faster by avoiding rescan.

    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
                chainstate->ResetCoinsViews();
            }
        }
    }
    for (const auto& client : node.chain_clients) {
        client->stop();
    }

#ifdef ENABLE_ZMQ
    if (g_zmq_notification_interface) {
        if (node.validation_signals) node.validation_signals->UnregisterValidationInterface(g_zmq_notification_interface.get());
        g_zmq_notification_interface.reset();
    }
#endif

    node.chain_clients.clear();
    if (node.validation_signals) {
        node.validation_signals->UnregisterAllValidationInterfaces();
    }
    node.mempool.reset();
    node.fee_estimator.reset();
    node.chainman.reset();
    node.validation_signals.reset();
    node.scheduler.reset();
    node.ecc_context.reset();
    node.kernel.reset();

    RemovePidFile(*node.args);

    LogPrintf("%s: done\n", __func__);
}